

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall gss::innards::Proof::create_clique_nonedge(Proof *this,int v,int w)

{
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar1;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  mapped_type *pmVar3;
  ostream *poVar4;
  pair<int,_int> local_40;
  long local_38;
  
  uVar1._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"u 1 ~x",6);
  local_40 = (pair<int,_int>)(long)v;
  pmVar3 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         binary_variable_mappings,(key_type_conflict1 *)&local_40);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," 1 ~x",5);
  local_38 = (long)w;
  pmVar3 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         binary_variable_mappings,&local_38);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," >= 1 ;\n",8);
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->proof_line = (_Var2._M_head_impl)->proof_line + 1;
  local_40.second = w;
  local_40.first = v;
  std::
  _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
  ::_M_emplace_unique<std::pair<int,int>,long&>
            ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
              *)&(_Var2._M_head_impl)->non_edge_constraints,&local_40,
             &(_Var2._M_head_impl)->proof_line);
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_40.second = v;
  local_40.first = w;
  std::
  _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
  ::_M_emplace_unique<std::pair<int,int>,long&>
            ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
              *)&(_Var2._M_head_impl)->non_edge_constraints,&local_40,
             &(_Var2._M_head_impl)->proof_line);
  return;
}

Assistant:

auto Proof::create_clique_nonedge(int v, int w) -> void
{
    *_imp->proof_stream << "u 1 ~x" << _imp->binary_variable_mappings[v]
                        << " 1 ~x" << _imp->binary_variable_mappings[w] << " >= 1 ;\n";
    ++_imp->proof_line;
    _imp->non_edge_constraints.emplace(pair{v, w}, _imp->proof_line);
    _imp->non_edge_constraints.emplace(pair{w, v}, _imp->proof_line);
}